

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

uint32_t __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::DivMod<10u>(BigUnsigned<84> *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar6;
  long lVar7;
  long lVar5;
  
  if ((long)this->size_ < 1) {
    uVar3 = 0;
  }
  else {
    lVar7 = (long)this->size_ + 1;
    lVar5 = 0;
    do {
      uVar4 = lVar5 << 0x20 | (ulong)this->words_[lVar7 + -2];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4;
      uVar6 = SUB168(auVar2 * ZEXT816(0x6666666666666667),8) >> 2;
      this->words_[lVar7 + -2] = (uint32_t)uVar6;
      lVar5 = uVar4 + uVar6 * -10;
      uVar3 = (uint32_t)lVar5;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar5 = (long)this->size_;
  if (0 < (long)this->size_) {
    do {
      if (this->words_[lVar5 + -1] != 0) {
        return uVar3;
      }
      this->size_ = (int)lVar5 + -1;
      bVar1 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar1);
  }
  return uVar3;
}

Assistant:

uint32_t DivMod() {
    uint64_t accumulator = 0;
    for (int i = size_ - 1; i >= 0; --i) {
      accumulator <<= 32;
      accumulator += words_[i];
      // accumulator / divisor will never overflow an int32_t in this loop
      words_[i] = static_cast<uint32_t>(accumulator / divisor);
      accumulator = accumulator % divisor;
    }
    while (size_ > 0 && words_[size_ - 1] == 0) {
      --size_;
    }
    return static_cast<uint32_t>(accumulator);
  }